

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialManager.cpp
# Opt level: O1

void __thiscall MT32Emu::PartialManager::~PartialManager(PartialManager *this)

{
  Partial *this_00;
  Bit32u BVar1;
  ulong uVar2;
  
  BVar1 = Synth::getPartialCount(this->synth);
  if (BVar1 != 0) {
    uVar2 = 0;
    do {
      this_00 = this->partialTable[uVar2];
      if (this_00 != (Partial *)0x0) {
        Partial::~Partial(this_00);
        operator_delete(this_00);
      }
      if (this->freePolys[uVar2] != (Poly *)0x0) {
        operator_delete(this->freePolys[uVar2]);
      }
      uVar2 = uVar2 + 1;
      BVar1 = Synth::getPartialCount(this->synth);
    } while (uVar2 < BVar1);
  }
  if (this->partialTable != (Partial **)0x0) {
    operator_delete__(this->partialTable);
  }
  if (this->inactivePartials != (int *)0x0) {
    operator_delete__(this->inactivePartials);
  }
  if (this->freePolys != (Poly **)0x0) {
    operator_delete__(this->freePolys);
    return;
  }
  return;
}

Assistant:

PartialManager::~PartialManager(void) {
	for (unsigned int i = 0; i < synth->getPartialCount(); i++) {
		delete partialTable[i];
		if (freePolys[i] != NULL) delete freePolys[i];
	}
	delete[] partialTable;
	delete[] inactivePartials;
	delete[] freePolys;
}